

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

void __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Insert
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  int iVar1;
  int iVar2;
  Node *pNVar3;
  char **in_RDI;
  int i_1;
  int i;
  int height;
  Node *x;
  Node *prev [12];
  memory_order __b;
  int n;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar4;
  int iVar5;
  int local_98;
  undefined8 local_88 [14];
  int local_18;
  memory_order local_14;
  int local_10;
  int local_c;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *local_8;
  
  FindGreaterOrEqual((SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_RDI,
                     (Node **)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  iVar1 = RandomHeight((SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  iVar4 = iVar1;
  iVar2 = GetMaxHeight(in_stack_ffffffffffffff48);
  if (iVar2 < iVar4) {
    for (local_98 = GetMaxHeight(in_stack_ffffffffffffff48); local_98 < iVar1;
        local_98 = local_98 + 1) {
      local_88[local_98] = in_RDI[3];
    }
    in_stack_ffffffffffffff48 =
         (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)(in_RDI + 4);
    local_10 = 0;
    local_c = iVar1;
    local_8 = in_stack_ffffffffffffff48;
    local_14 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_18 = local_c;
    in_stack_ffffffffffffff54 = local_10;
    if (local_10 == 3) {
      *(int *)&(in_stack_ffffffffffffff48->compare_).comparator.super_Comparator._vptr_Comparator =
           local_c;
    }
    else if (local_10 == 5) {
      LOCK();
      *(int *)&(in_stack_ffffffffffffff48->compare_).comparator.super_Comparator._vptr_Comparator =
           local_c;
      UNLOCK();
    }
    else {
      *(int *)&(in_stack_ffffffffffffff48->compare_).comparator.super_Comparator._vptr_Comparator =
           local_c;
    }
  }
  pNVar3 = NewNode((SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (char **)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  iVar2 = (int)((ulong)pNVar3 >> 0x20);
  iVar4 = 0;
  while (iVar4 < iVar1) {
    iVar5 = iVar4;
    n = iVar2;
    Node::NoBarrier_Next((Node *)CONCAT44(iVar4,in_stack_ffffffffffffff40),iVar2);
    Node::NoBarrier_SetNext((Node *)CONCAT44(iVar4,in_stack_ffffffffffffff40),n,(Node *)0x122a89);
    Node::SetNext((Node *)CONCAT44(iVar4,in_stack_ffffffffffffff40),n,(Node *)0x122aa1);
    iVar4 = iVar5 + 1;
  }
  return;
}

Assistant:

void SkipList<Key, Comparator>::Insert(const Key& key) {
  // TODO(opt): We can use a barrier-free variant of FindGreaterOrEqual()
  // here since Insert() is externally synchronized.
  Node* prev[kMaxHeight];
  Node* x = FindGreaterOrEqual(key, prev);

  // Our data structure does not allow duplicate insertion
  assert(x == nullptr || !Equal(key, x->key));

  int height = RandomHeight();
  if (height > GetMaxHeight()) {
    for (int i = GetMaxHeight(); i < height; i++) {
      prev[i] = head_;
    }
    // It is ok to mutate max_height_ without any synchronization
    // with concurrent readers.  A concurrent reader that observes
    // the new value of max_height_ will see either the old value of
    // new level pointers from head_ (nullptr), or a new value set in
    // the loop below.  In the former case the reader will
    // immediately drop to the next level since nullptr sorts after all
    // keys.  In the latter case the reader will use the new node.
    max_height_.store(height, std::memory_order_relaxed);
  }

  x = NewNode(key, height);
  for (int i = 0; i < height; i++) {
    // NoBarrier_SetNext() suffices since we will add a barrier when
    // we publish a pointer to "x" in prev[i].
    x->NoBarrier_SetNext(i, prev[i]->NoBarrier_Next(i));
    prev[i]->SetNext(i, x);
  }
}